

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_recv_start(uv_udp_t *handle,uv_alloc_cb alloc_cb,uv_udp_recv_cb recv_cb)

{
  int iVar1;
  int err;
  uv_udp_recv_cb recv_cb_local;
  uv_alloc_cb alloc_cb_local;
  uv_udp_t *handle_local;
  
  if ((alloc_cb == (uv_alloc_cb)0x0) || (recv_cb == (uv_udp_recv_cb)0x0)) {
    handle_local._4_4_ = -0x16;
  }
  else {
    iVar1 = uv__io_active(&handle->io_watcher,1);
    if (iVar1 == 0) {
      handle_local._4_4_ = uv__udp_maybe_deferred_bind(handle,2,0);
      if (handle_local._4_4_ == 0) {
        handle->alloc_cb = alloc_cb;
        handle->recv_cb = recv_cb;
        uv__io_start(handle->loop,&handle->io_watcher,1);
        if (((handle->flags & 0x4000) == 0) &&
           (handle->flags = handle->flags | 0x4000, (handle->flags & 0x2000) != 0)) {
          handle->loop->active_handles = handle->loop->active_handles + 1;
        }
        handle_local._4_4_ = 0;
      }
    }
    else {
      handle_local._4_4_ = -0x72;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv__udp_recv_start(uv_udp_t* handle,
                       uv_alloc_cb alloc_cb,
                       uv_udp_recv_cb recv_cb) {
  int err;

  if (alloc_cb == NULL || recv_cb == NULL)
    return -EINVAL;

  if (uv__io_active(&handle->io_watcher, POLLIN))
    return -EALREADY;  /* FIXME(bnoordhuis) Should be -EBUSY. */

  err = uv__udp_maybe_deferred_bind(handle, AF_INET, 0);
  if (err)
    return err;

  handle->alloc_cb = alloc_cb;
  handle->recv_cb = recv_cb;

  uv__io_start(handle->loop, &handle->io_watcher, POLLIN);
  uv__handle_start(handle);

  return 0;
}